

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.c
# Opt level: O2

char * token_pos(Token *token)

{
  CharBuff *buff;
  char *pcVar1;
  
  buff = new_buff(4);
  append_chr(buff,'(');
  pcVar1 = itochr(token->row_pos);
  append_str(buff,pcVar1);
  append_chr(buff,',');
  pcVar1 = itochr(token->col_pos);
  append_str(buff,pcVar1);
  append_chr(buff,')');
  append_chr(buff,'\0');
  pcVar1 = to_string(buff);
  free(buff->body);
  free(buff);
  return pcVar1;
}

Assistant:

char *token_pos(Token *token) {
    CharBuff *buff = new_buff(4);
    append_chr(buff, '(');
    append_str(buff, itochr((int) token->row_pos));
    append_chr(buff, ',');
    append_str(buff, itochr((int) token->col_pos));
    append_chr(buff, ')');
    append_chr(buff, '\0');
    char *s = to_string(buff);
    free(buff->body);
    free(buff);
    return s;
}